

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

unsigned_long __thiscall
ObjectFile::getUnsignedLongValue(ObjectFile *this,CK_ATTRIBUTE_TYPE type,unsigned_long val)

{
  OSAttribute *this_00;
  bool bVar1;
  mapped_type *ppOVar2;
  int lineNo;
  char *format;
  CK_ATTRIBUTE_TYPE type_local;
  MutexLocker lock;
  
  type_local = type;
  MutexLocker::MutexLocker(&lock,this->objectMutex);
  ppOVar2 = std::
            map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
            ::operator[](&this->attributes,&type_local);
  this_00 = *ppOVar2;
  if (this_00 == (OSAttribute *)0x0) {
    format = "The attribute does not exist: 0x%08X";
    lineNo = 0x93;
  }
  else {
    bVar1 = OSAttribute::isUnsignedLongAttribute(this_00);
    if (bVar1) {
      val = OSAttribute::getUnsignedLongValue(this_00);
      goto LAB_0012f2f6;
    }
    format = "The attribute is not an unsigned long: 0x%08X";
    lineNo = 0x9d;
  }
  softHSMLog(3,"getUnsignedLongValue",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
             ,lineNo,format,type_local);
LAB_0012f2f6:
  MutexLocker::~MutexLocker(&lock);
  return val;
}

Assistant:

unsigned long ObjectFile::getUnsignedLongValue(CK_ATTRIBUTE_TYPE type, unsigned long val)
{
	MutexLocker lock(objectMutex);

	OSAttribute* attr = attributes[type];
	if (attr == NULL)
	{
		ERROR_MSG("The attribute does not exist: 0x%08X", type);
		return val;
	}

	if (attr->isUnsignedLongAttribute())
	{
		return attr->getUnsignedLongValue();
	}
	else
	{
		ERROR_MSG("The attribute is not an unsigned long: 0x%08X", type);
		return val;
	}
}